

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O0

void Of_StoDelete(Of_Man_t *p)

{
  Of_Man_t *p_local;
  
  Vec_PtrFreeData(&p->vPages);
  Vec_PtrErase(&p->vPages);
  Vec_IntErase(&p->vCutSets);
  Vec_IntErase(&p->vCutFlows);
  Vec_IntErase(&p->vCutDelays);
  Vec_IntErase(&p->vCutRefs);
  if (p->pObjs != (Of_Obj_t *)0x0) {
    free(p->pObjs);
    p->pObjs = (Of_Obj_t *)0x0;
  }
  if (p->pPars->fCutMin != 0) {
    Vec_MemHashFree(p->vTtMem);
  }
  if (p->pPars->fCutMin != 0) {
    Vec_MemFree(p->vTtMem);
  }
  if (p != (Of_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Of_StoDelete( Of_Man_t * p )
{
    Vec_PtrFreeData( &p->vPages );
    Vec_PtrErase( &p->vPages );
    Vec_IntErase( &p->vCutSets );
    Vec_IntErase( &p->vCutFlows );
    Vec_IntErase( &p->vCutDelays );
    Vec_IntErase( &p->vCutRefs );
    ABC_FREE( p->pObjs );
    // matching
    if ( p->pPars->fCutMin )
        Vec_MemHashFree( p->vTtMem );
    if ( p->pPars->fCutMin )
        Vec_MemFree( p->vTtMem );
    ABC_FREE( p );
}